

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

Table * __thiscall
Table::slice(Table *__return_storage_ptr__,Table *this,int l_col,int r_col,int l_row,int r_row)

{
  __tuple_element_t<1UL,_tuple<basic_string<char>,_types,_int>_> _Var1;
  int iVar2;
  reference pvVar3;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_types,_int>_> *__x;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_types,_int>_> *p_Var4;
  __tuple_element_t<2UL,_tuple<basic_string<char>,_types,_int>_> *p_Var5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  string local_d8;
  int local_b4;
  undefined1 local_b0 [4];
  int j_2;
  int local_8c;
  undefined1 local_88 [4];
  int j_1;
  int local_64;
  __tuple_element_t<2UL,_tuple<basic_string<char>,_types,_int>_> local_60;
  int j;
  int cnt;
  int i_1;
  int local_44;
  undefined1 local_40 [4];
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  new_columns;
  int r_row_local;
  int l_row_local;
  int r_col_local;
  int l_col_local;
  Table *this_local;
  Table *t;
  
  new_columns.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = r_row;
  new_columns.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = l_row;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40);
  for (local_44 = l_col; local_44 < r_col; local_44 = local_44 + 1) {
    pvVar3 = std::
             vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
             ::operator[](&this->columns,(long)local_44);
    __x = std::get<0ul,std::__cxx11::string,Table::types,int>(pvVar3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40,__x);
  }
  cnt._3_1_ = 0;
  Table(__return_storage_ptr__,
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_40);
  j = l_col;
  do {
    if (r_col <= j) {
      cnt._3_1_ = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40);
      return __return_storage_ptr__;
    }
    iVar2 = j - l_col;
    pvVar3 = std::
             vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
             ::operator[](&this->columns,(long)j);
    p_Var4 = std::get<1ul,std::__cxx11::string,Table::types,int>(pvVar3);
    define_column_type(__return_storage_ptr__,iVar2,*p_Var4);
    pvVar3 = std::
             vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
             ::operator[](&this->columns,(long)j);
    p_Var5 = std::get<2ul,std::__cxx11::string,Table::types,int>(pvVar3);
    local_60 = *p_Var5;
    pvVar3 = std::
             vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
             ::operator[](&this->columns,(long)j);
    p_Var4 = std::get<1ul,std::__cxx11::string,Table::types,int>(pvVar3);
    _Var1 = *p_Var4;
    if (_Var1 == STRING) {
      for (local_b4 = new_columns.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          local_b4 <
          (int)new_columns.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage; local_b4 = local_b4 + 1) {
        iVar2 = j - l_col;
        pvVar10 = std::
                  vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[](&this->string_cols,(long)local_60);
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&pvVar10->second,(long)local_b4);
        std::__cxx11::string::string((string *)&local_d8,(string *)pvVar11);
        push_new_value_in_column(__return_storage_ptr__,iVar2,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
      }
    }
    else if (_Var1 == INT) {
      for (local_64 = new_columns.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          local_64 <
          (int)new_columns.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage; local_64 = local_64 + 1) {
        iVar2 = j - l_col;
        pvVar6 = std::
                 vector<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                 ::operator[](&this->int_cols,(long)local_60);
        pvVar7 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                           (&pvVar6->second,(long)local_64);
        std::__cxx11::to_string((string *)local_88,*pvVar7);
        push_new_value_in_column(__return_storage_ptr__,iVar2,(string *)local_88);
        std::__cxx11::string::~string((string *)local_88);
      }
    }
    else {
      if (_Var1 != FLOAT) {
        std::operator<<((ostream *)&std::cerr,"slice\n");
        exit(1);
      }
      for (local_8c = new_columns.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          local_8c <
          (int)new_columns.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage; local_8c = local_8c + 1) {
        iVar2 = j - l_col;
        pvVar8 = std::
                 vector<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
                 ::operator[](&this->float_cols,(long)local_60);
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&pvVar8->second,(long)local_8c);
        std::__cxx11::to_string((string *)local_b0,*pvVar9);
        push_new_value_in_column(__return_storage_ptr__,iVar2,(string *)local_b0);
        std::__cxx11::string::~string((string *)local_b0);
      }
    }
    j = j + 1;
  } while( true );
}

Assistant:

Table Table::slice(int l_col, int r_col, int l_row, int r_row){
    std::vector<std::string> new_columns;
    for (int i = l_col; i < r_col; ++i)
        new_columns.push_back(std::get<0>(columns[i]));
    Table t(new_columns);
    for (int i = l_col; i < r_col; ++i){
        t.define_column_type(i-l_col, std::get<1>(columns[i]));
        int cnt = std::get<2>(columns[i]);
        switch (std::get<1>(columns[i])) {
            case INT:
                for (int j = l_row; j < r_row; ++j)
                    t.push_new_value_in_column(i-l_col, std::to_string(int_cols[cnt].second[j]));
                break;
            case FLOAT:
                for (int j = l_row; j < r_row; ++j)
                    t.push_new_value_in_column(i-l_col, std::to_string(float_cols[cnt].second[j]));
                break;
            case STRING:
                for (int j = l_row; j < r_row; ++j)
                    t.push_new_value_in_column(i-l_col, string_cols[cnt].second[j]);
                break;
            default:
                std::cerr << "slice\n";
                exit(EXIT_FAILURE);
        }
    }
    return t;
}